

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall
QFutureInterfaceBase::setProgressRange(QFutureInterfaceBase *this,int minimum,int maximum)

{
  bool bVar1;
  void *__s;
  ProgressData *pPVar2;
  CallOutType *pCVar3;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  CallOutType callOutType;
  QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
  *in_stack_ffffffffffffff60;
  QFutureInterfaceBasePrivate *this_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar4;
  int local_20;
  int local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_1c = in_ESI;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  bVar1 = QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
          ::operator!((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                       *)(*(long *)(in_RDI + 8) + 200));
  if (bVar1) {
    __s = operator_new(0x20);
    memset(__s,0,0x20);
    QFutureInterfaceBasePrivate::ProgressData::ProgressData((ProgressData *)0x6ddf13);
    QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
    ::reset(in_stack_ffffffffffffff60,
            (ProgressData *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  iVar4 = local_1c;
  pPVar2 = QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
           ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                         *)(*(long *)(in_RDI + 8) + 200));
  pPVar2->minimum = iVar4;
  pCVar3 = (CallOutType *)qMax<int>(&local_1c,&local_20);
  callOutType = *pCVar3;
  pPVar2 = QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
           ::operator->((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                         *)(*(long *)(in_RDI + 8) + 200));
  pPVar2->maximum = callOutType;
  this_00 = *(QFutureInterfaceBasePrivate **)(in_RDI + 8);
  QFutureCallOutEvent::QFutureCallOutEvent
            ((QFutureCallOutEvent *)this_00,callOutType,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff54);
  QFutureInterfaceBasePrivate::sendCallOut
            (this_00,(QFutureCallOutEvent *)CONCAT44(callOutType,in_stack_ffffffffffffff58));
  QFutureCallOutEvent::~QFutureCallOutEvent
            ((QFutureCallOutEvent *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  *(int *)(*(long *)(in_RDI + 8) + 0xc4) = local_1c;
  QMutexLocker<QMutex>::~QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::setProgressRange(int minimum, int maximum)
{
    QMutexLocker locker(&d->m_mutex);
    if (!d->m_progress)
        d->m_progress.reset(new QFutureInterfaceBasePrivate::ProgressData());
    d->m_progress->minimum = minimum;
    d->m_progress->maximum = qMax(minimum, maximum);
    d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::ProgressRange, minimum, maximum));
    d->m_progressValue = minimum;
}